

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void pnga_get(Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld)

{
  long lVar1;
  int *piVar2;
  long *plVar3;
  short sVar4;
  long lVar5;
  cache_struct *__ptr;
  cache_struct *pcVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  global_array_t *pgVar10;
  Integer IVar11;
  Integer IVar12;
  int iVar13;
  cache_struct_t *pcVar14;
  void *pvVar15;
  long lVar16;
  ulong uVar17;
  uint ndim;
  ulong uVar18;
  int temp_lo [7];
  int temp_hi [7];
  Integer bstart [7];
  Integer nld [7];
  Integer ncount [7];
  Integer nstart [7];
  
  lVar1 = g_a + 1000;
  if (GA[lVar1].property != 2) {
    ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)0x0);
    return;
  }
  sVar4 = GA[lVar1].ndim;
  ndim = (uint)sVar4;
  pcVar14 = GA[lVar1].cache_head;
  if (pcVar14 == (cache_struct_t *)0x0) {
    pgVar10 = GA + lVar1;
    pcVar14 = (cache_struct_t *)malloc(0x48);
    pgVar10->cache_head = pcVar14;
    if (sVar4 < 1) {
      iVar13 = 1;
    }
    else {
      pcVar14 = GA[lVar1].cache_head;
      iVar13 = 1;
      uVar18 = 0;
      do {
        IVar11 = lo[uVar18];
        pcVar14->lo[uVar18] = (int)IVar11;
        IVar12 = hi[uVar18];
        pcVar14->hi[uVar18] = (int)IVar12;
        iVar13 = iVar13 * (((int)IVar12 - (int)IVar11) + 1);
        uVar18 = uVar18 + 1;
      } while (ndim != uVar18);
    }
    pgVar10 = GA;
    pvVar15 = malloc((long)iVar13 * (long)GA[lVar1].elemsize);
    pcVar14 = pgVar10[lVar1].cache_head;
    pcVar14->cache_buf = pvVar15;
    pcVar14->next = (cache_struct *)0x0;
    ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)0x0);
    if (0 < sVar4) {
      uVar18 = 0;
      memset(nstart,0,(ulong)(ndim * 8));
      memset(bstart,0,(ulong)(ndim * 8));
      do {
        lVar16 = (hi[uVar18] - lo[uVar18]) + 1;
        nld[uVar18] = lVar16;
        ncount[uVar18] = lVar16;
        uVar18 = uVar18 + 1;
      } while (ndim != uVar18);
    }
  }
  else {
    bVar8 = 0 < sVar4;
    uVar18 = (ulong)ndim;
    bVar9 = false;
    do {
      if (pcVar14 == (cache_struct_t *)0x0) break;
      pvVar15 = pcVar14->cache_buf;
      if (0 < sVar4) {
        uVar17 = 0;
        do {
          temp_lo[uVar17] = pcVar14->lo[uVar17];
          temp_hi[uVar17] = pcVar14->hi[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
      bVar7 = bVar8;
      if (sVar4 < 1) {
LAB_0016de93:
        if (0 < sVar4) {
          memset(bstart,0,uVar18 * 8);
          lVar16 = 0;
          do {
            lVar5 = *(long *)((long)lo + lVar16 * 2);
            iVar13 = *(int *)((long)temp_lo + lVar16);
            *(long *)((long)nstart + lVar16 * 2) = lVar5 - iVar13;
            *(long *)((long)nld + lVar16 * 2) =
                 (long)((*(int *)((long)temp_hi + lVar16) - iVar13) + 1);
            *(long *)((long)ncount + lVar16 * 2) = (*(long *)((long)hi + lVar16 * 2) - lVar5) + 1;
            lVar16 = lVar16 + 4;
          } while (uVar18 * 4 - lVar16 != 0);
        }
        gai_mem_copy(GA[lVar1].elemsize,ndim,pvVar15,nstart,ncount,nld,buf,bstart,ncount);
        bVar9 = true;
      }
      else {
        if ((long)temp_lo[0] <= *lo) {
          uVar17 = 1;
          do {
            if ((long)temp_hi[uVar17 - 1] < hi[uVar17 - 1]) break;
            bVar7 = (long)uVar17 < (long)(int)ndim;
            if (uVar18 == uVar17) goto LAB_0016de93;
            piVar2 = temp_lo + uVar17;
            plVar3 = lo + uVar17;
            uVar17 = uVar17 + 1;
          } while ((long)*piVar2 <= *plVar3);
        }
        pcVar14 = pcVar14->next;
      }
    } while (bVar7);
    if (bVar9) goto LAB_0016e230;
    pcVar14 = (cache_struct_t *)malloc(0x48);
    iVar13 = 1;
    if (0 < sVar4) {
      uVar17 = 0;
      do {
        IVar11 = lo[uVar17];
        pcVar14->lo[uVar17] = (int)IVar11;
        IVar12 = hi[uVar17];
        pcVar14->hi[uVar17] = (int)IVar12;
        iVar13 = iVar13 * (((int)IVar12 - (int)IVar11) + 1);
        uVar17 = uVar17 + 1;
      } while (uVar18 != uVar17);
    }
    pgVar10 = GA;
    pvVar15 = malloc((long)iVar13 * (long)GA[lVar1].elemsize);
    pcVar14->cache_buf = pvVar15;
    pcVar14->next = pgVar10[lVar1].cache_head;
    pgVar10[lVar1].cache_head = pcVar14;
    ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)0x0);
    if (0 < sVar4) {
      uVar17 = 0;
      memset(nstart,0,(ulong)(ndim * 8));
      memset(bstart,0,(ulong)(ndim * 8));
      do {
        lVar16 = (hi[uVar17] - lo[uVar17]) + 1;
        nld[uVar17] = lVar16;
        ncount[uVar17] = lVar16;
        uVar17 = uVar17 + 1;
      } while (uVar18 != uVar17);
    }
  }
  gai_mem_copy(GA[lVar1].elemsize,ndim,buf,bstart,ncount,ld,pvVar15,nstart,nld);
LAB_0016e230:
  pcVar14 = GA[lVar1].cache_head;
  if (pcVar14 != (cache_struct_t *)0x0) {
    iVar13 = 0xc;
    do {
      iVar13 = iVar13 + -1;
      if (iVar13 == 0) {
        __ptr = pcVar14->next;
        pcVar14->next = (cache_struct *)0x0;
        pcVar6 = __ptr;
        while (pcVar6 != (cache_struct *)0x0) {
          pcVar6 = __ptr->next;
          free(__ptr->cache_buf);
          free(__ptr);
        }
        return;
      }
    } while (pcVar14 != (cache_struct_t *)0x0);
  }
  return;
}

Assistant:

void pnga_get(Integer g_a, Integer *lo, Integer *hi,
              void *buf, Integer *ld)
{
  Integer handle = GA_OFFSET + g_a;
  enum property_type ga_property = GA[handle].property;

  if (ga_property != READ_CACHE) /* if array is not read only */
  {
    GA_Internal_Threadsafe_Lock();
    ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)NULL);
    GA_Internal_Threadsafe_Unlock();
  } else {
    int i;
    int nelem;
    int ndim = GA[handle].ndim;
    Integer nstart[MAXDIM], ncount[MAXDIM], nld[MAXDIM];
    Integer bstart[MAXDIM];
    /* ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)NULL); */

    /* cache is empty condition */
    if (GA[handle].cache_head == NULL) {
      GA[handle].cache_head = malloc(sizeof(cache_struct_t));
      nelem = 1;
      for (i=0; i<ndim; i++) {
        GA[handle].cache_head -> lo[i] = lo[i];
        GA[handle].cache_head -> hi[i] = hi[i];
        nelem *= (hi[i]-lo[i]+1);
      }
      GA[handle].cache_head -> cache_buf = malloc(GA[handle].elemsize*nelem);
      GA[handle].cache_head -> next = NULL;

        void *new_buf = GA[handle].cache_head->cache_buf;

      /* place data to receive buffer */
      ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer*)NULL);
   
      for (i=0; i<ndim; i++) {
        nstart[i] = 0;
        bstart[i] = 0;
        nld[i] = (hi[i]-lo[i]+1);
        ncount[i] = nld[i];
      }
      gai_mem_copy(GA[handle].elemsize,ndim,buf,bstart,ncount,ld,new_buf,
          nstart, nld);
    } else {

      cache_struct_t * cache_temp_pointer = GA[handle].cache_head;
      int match = 0;
      while (cache_temp_pointer != NULL) {
        int chk;
        int sub_chk;
        int temp_lo[MAXDIM];
        int temp_hi[MAXDIM];
        void *temp_buf = cache_temp_pointer->cache_buf;
        for (i=0; i<ndim; i++) {
          temp_lo[i] = cache_temp_pointer->lo[i];
          temp_hi[i] = cache_temp_pointer->hi[i];
        }

        //match
        chk = 1;
        for (i=0; i<ndim; i++) {
          if (!(temp_lo[i] <= lo[i] && temp_hi[i] >= hi[i])) {
            chk = 0;
            break;
          }
        }
        //match
        if (chk) {
          nelem = 1;
          for (i=0; i<ndim; i++) {
            nelem *= (hi[i]-lo[i]+1);
          }
          for (i=0; i<ndim; i++) {
            nstart[i] = (lo[i]-temp_lo[i]);
            bstart[i] = 0;
            nld[i] = (temp_hi[i]-temp_lo[i]+1);
            ncount[i] = (hi[i]-lo[i]+1);
          }
          /* copy data to recieve buffer */
          gai_mem_copy(GA[handle].elemsize,ndim,temp_buf,nstart,ncount,nld,buf,
              bstart, ncount /*ld*/);
          match = 1;
          break;
        }

        cache_temp_pointer = cache_temp_pointer->next;

      }

      //no match condition
      if (match == 0) {
        void *new_buf;
        /* create new node on cache list*/
        cache_struct_t *cache_new = malloc(sizeof(cache_struct_t));
        nelem = 1;
        for (i=0; i<ndim; i++) {
          cache_new -> lo[i] = lo[i];
          cache_new -> hi[i] = hi[i];
          nelem *= (hi[i]-lo[i]+1);
        }
        cache_new -> cache_buf = malloc(GA[handle].elemsize*nelem);
        new_buf = cache_new->cache_buf;
        cache_new -> next = GA[handle].cache_head;
        GA[handle].cache_head = cache_new;


        //place data to recieve buffer
        ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)NULL);

        for (i=0; i<ndim; i++) {
          nstart[i] = 0;
          bstart[i] = 0;
          nld[i] = (hi[i]-lo[i]+1);
          ncount[i] = nld[i];
        }
        gai_mem_copy(GA[handle].elemsize,ndim,buf,bstart,ncount,ld,new_buf,
            nstart, nld);
      }
    }

    /* check number of items cached */
    cache_struct_t * cache_temp_pointer = GA[handle].cache_head;
    int cache_size = 0;

    /* check number of items cached */
    while (cache_temp_pointer != NULL) {
      if (cache_size > MAXCACHE) {
        cache_struct_t *last = cache_temp_pointer;
        cache_struct_t *next = last->next;
        last->next = NULL;
        cache_temp_pointer = next;
        while (next) {
          next = cache_temp_pointer->next;
          free(cache_temp_pointer->cache_buf);
          free(cache_temp_pointer);
        }
        break;
      }
      cache_size++;
    }
    /* end */
  }
}